

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

void note_anctar_reps(saucy *s)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int tmp;
  int rep;
  int f;
  int m;
  int k;
  int j;
  int i;
  saucy *s_local;
  
  k = s->splitlev[s->anc + 1];
  while (k = k + -1, s->splitlev[s->anc] <= k) {
    iVar1 = s->splitfrom[k];
    iVar2 = s->threp[iVar1];
    rep = s->threp[s->splitwho[k]];
    s->thnext[s->thprev[iVar2]] = rep;
    s->thnext[s->thprev[rep]] = iVar2;
    iVar3 = s->thprev[iVar2];
    s->thprev[iVar2] = s->thprev[rep];
    s->thprev[rep] = iVar3;
    for (; rep != iVar2; rep = s->thnext[rep]) {
      s->thfront[rep] = iVar1;
    }
  }
  s->kanctar = 0;
  iVar1 = s->threp[s->start[s->lev]];
  iVar2 = s->kanctar;
  s->kanctar = iVar2 + 1;
  s->anctar[iVar2] = iVar1;
  for (f = s->thnext[iVar1]; f != iVar1; f = s->thnext[f]) {
    iVar2 = s->kanctar;
    s->kanctar = iVar2 + 1;
    s->anctar[iVar2] = f;
  }
  array_indirect_sort(s->anctar,s->thsize,s->kanctar);
  return;
}

Assistant:

static void
note_anctar_reps(struct saucy *s)
{
    int i, j, k, m, f, rep, tmp;

    /*
     * Undo the previous level's splits along leftmost so that we
     * join the appropriate lists of theta reps.
     */
    for (i = s->splitlev[s->anc+1]-1; i >= s->splitlev[s->anc]; --i) {
        f = s->splitfrom[i];
        j = s->threp[f];
        k = s->threp[s->splitwho[i]];

        s->thnext[s->thprev[j]] = k;
        s->thnext[s->thprev[k]] = j;

        tmp = s->thprev[j];
        s->thprev[j] = s->thprev[k];
        s->thprev[k] = tmp;

        for (m = k; m != j; m = s->thnext[m]) {
            s->thfront[m] = f;
        }
    }

    /*
     * Just copy over the target's reps and sort by cell size, in
     * the hopes of trimming some otherwise redundant generators.
     */
    s->kanctar = 0;
    s->anctar[s->kanctar++] = rep = s->threp[s->start[s->lev]];
    for (k = s->thnext[rep]; k != rep; k = s->thnext[k]) {
        s->anctar[s->kanctar++] = k;
    }
    array_indirect_sort(s->anctar, s->thsize, s->kanctar);
}